

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

ChFrameMoving<double> * __thiscall
chrono::ChFrameMoving<double>::operator=(ChFrameMoving<double> *this,ChFrameMoving<double> *other)

{
  if (other != this) {
    ChFrame<double>::operator=(&this->super_ChFrame<double>,&other->super_ChFrame<double>);
    ChCoordsys<double>::operator=(&this->coord_dt,&other->coord_dt);
    ChCoordsys<double>::operator=(&this->coord_dtdt,&other->coord_dtdt);
  }
  return this;
}

Assistant:

ChFrameMoving<Real>& operator=(const ChFrameMoving<Real>& other) {
        if (&other == this)
            return *this;
        ChFrame<Real>::operator=(other);
        coord_dt = other.coord_dt;
        coord_dtdt = other.coord_dtdt;
        return *this;
    }